

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

bool __thiscall fasttext::Dictionary::readWord(Dictionary *this,istream *in,string *word)

{
  uint uVar1;
  
  word->_M_string_length = 0;
  *(word->_M_dataplus)._M_p = '\0';
  while( true ) {
    while( true ) {
      uVar1 = std::streambuf::sbumpc();
      if (uVar1 == 0xffffffff) {
        std::istream::get();
        return word->_M_string_length != 0;
      }
      if ((uVar1 < 0x21) && ((0x100003e01U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) break;
      std::__cxx11::string::push_back((char)word);
    }
    if (word->_M_string_length != 0) break;
    if (uVar1 == 10) {
      std::__cxx11::string::append((string *)word);
      return true;
    }
  }
  if (uVar1 != 10) {
    return true;
  }
  std::streambuf::sungetc();
  return true;
}

Assistant:

bool Dictionary::readWord(std::istream& in, std::string& word) const {
  int c;
  std::streambuf& sb = *in.rdbuf();
  word.clear();
  while ((c = sb.sbumpc()) != EOF) {
    if (c == ' ' || c == '\n' || c == '\r' || c == '\t' || c == '\v' ||
        c == '\f' || c == '\0') {
      if (word.empty()) {
        if (c == '\n') {
          word += EOS;
          return true;
        }
        continue;
      } else {
        if (c == '\n')
          sb.sungetc();
        return true;
      }
    }
    word.push_back(c);
  }
  // trigger eofbit
  in.get();
  return !word.empty();
}